

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::FunctionalTest::prepareDstPxls
          (FunctionalTest *this,targetDesc *desc,GLubyte **out_pixels)

{
  GLenum internal_format_00;
  GLenum type_00;
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  bool bVar4;
  GLuint GVar5;
  uint uVar6;
  GLubyte *pGVar7;
  TestError *this_00;
  GLubyte *pixel_data;
  GLuint j;
  GLubyte *ptr;
  GLuint n_pixels;
  GLuint n_layers;
  GLuint i_1;
  GLuint req_memory_for_level;
  GLuint req_memory_per_layer;
  GLuint i;
  GLuint depths [3];
  GLuint widths [3];
  GLuint heights [3];
  GLenum type;
  GLuint pixel_size;
  GLuint n_levels;
  bool is_multi_level;
  GLenum internal_format;
  GLubyte **out_pixels_local;
  targetDesc *desc_local;
  FunctionalTest *this_local;
  
  internal_format_00 = desc->m_internal_format;
  bVar4 = Utils::isTargetMultilevel(desc->m_target);
  type = 1;
  GVar5 = Utils::getPixelSizeForFormat(desc->m_internal_format);
  type_00 = desc->m_type;
  if (bVar4) {
    type = 3;
  }
  calculateDimmensions
            (this,desc->m_target,desc->m_level,desc->m_width,desc->m_height,depths + 1,widths + 1,
             &req_memory_per_layer);
  req_memory_for_level = 0;
  while( true ) {
    if (type <= req_memory_for_level) {
      for (n_pixels = 0; n_pixels < type; n_pixels = n_pixels + 1) {
        GVar1 = (&req_memory_per_layer)[n_pixels];
        GVar2 = depths[(ulong)n_pixels + 1];
        GVar3 = widths[(ulong)n_pixels + 1];
        pGVar7 = out_pixels[n_pixels];
        for (pixel_data._4_4_ = 0; pixel_data._4_4_ < GVar2 * GVar3 * GVar1;
            pixel_data._4_4_ = pixel_data._4_4_ + 1) {
          Utils::packPixel(internal_format_00,type_00,1.0,1.0,1.0,1.0,
                           pGVar7 + pixel_data._4_4_ * GVar5);
        }
      }
      return;
    }
    uVar6 = GVar5 * depths[(ulong)req_memory_for_level + 1] *
            widths[(ulong)req_memory_for_level + 1] * (&req_memory_per_layer)[req_memory_for_level];
    pGVar7 = (GLubyte *)operator_new__((ulong)uVar6);
    out_pixels[req_memory_for_level] = pGVar7;
    if (out_pixels[req_memory_for_level] == (GLubyte *)0x0) break;
    memset(out_pixels[req_memory_for_level],0,(ulong)uVar6);
    req_memory_for_level = req_memory_for_level + 1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Memory allocation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
             ,0xcb2);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void FunctionalTest::prepareDstPxls(const FunctionalTest::targetDesc& desc, GLubyte** out_pixels) const
{
	const GLenum internal_format = desc.m_internal_format;
	const bool   is_multi_level  = Utils::isTargetMultilevel(desc.m_target);
	GLuint		 n_levels		 = 1;
	const GLuint pixel_size		 = Utils::getPixelSizeForFormat(desc.m_internal_format);
	const GLenum type			 = desc.m_type;

	/* Configure levels */
	if (true == is_multi_level)
	{
		n_levels = FUNCTIONAL_TEST_N_LEVELS;
	}

	/* Calculate dimmensions */
	GLuint heights[FUNCTIONAL_TEST_N_LEVELS];
	GLuint widths[FUNCTIONAL_TEST_N_LEVELS];
	GLuint depths[FUNCTIONAL_TEST_N_LEVELS];

	calculateDimmensions(desc.m_target, desc.m_level, desc.m_width, desc.m_height, widths, heights, depths);

	/* Prepare storage */
	for (GLuint i = 0; i < n_levels; ++i)
	{
		const GLuint req_memory_per_layer = pixel_size * widths[i] * heights[i];
		const GLuint req_memory_for_level = req_memory_per_layer * depths[i];

		out_pixels[i] = new GLubyte[req_memory_for_level];

		if (0 == out_pixels[i])
		{
			TCU_FAIL("Memory allocation failed");
		}

		memset(out_pixels[i], 0, req_memory_for_level);
	}

	/* Fill pixels */
	for (GLuint i = 0; i < n_levels; ++i)
	{
		const GLuint n_layers = depths[i];
		const GLuint n_pixels = widths[i] * heights[i];
		GLubyte*	 ptr	  = (GLubyte*)out_pixels[i];

		for (GLuint j = 0; j < n_pixels * n_layers; ++j)
		{
			GLubyte* pixel_data = ptr + j * pixel_size;

			Utils::packPixel(internal_format, type, 1.0, 1.0, 1.0, 1.0, pixel_data);
		}
	}
}